

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O3

shared_ptr<cppcms::session_api> __thiscall
cppcms::session_pool::dual_factory::get(dual_factory *this)

{
  undefined8 *puVar1;
  session_dual *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long in_RSI;
  shared_ptr<cppcms::session_api> sVar2;
  unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
  local_40;
  shared_ptr<cppcms::sessions::session_storage> local_38;
  
  (this->super_session_api_factory)._vptr_session_api_factory = (_func_int **)0x0;
  *(undefined8 *)&this->limit_ = 0;
  if ((*(long *)(*(long *)(in_RSI + 0x10) + 0x18) != 0) &&
     (puVar1 = *(undefined8 **)(*(long *)(in_RSI + 0x10) + 0x10), puVar1 != (undefined8 *)0x0)) {
    this_00 = (session_dual *)operator_new(0x38);
    (**(code **)*puVar1)(&local_40,puVar1);
    (**(code **)**(undefined8 **)(*(long *)(in_RSI + 0x10) + 0x18))(&local_38);
    sessions::session_dual::session_dual(this_00,&local_40,&local_38,(ulong)*(uint *)(in_RSI + 8));
    std::__shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>::
    reset<cppcms::sessions::session_dual>
              ((__shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2> *)this,this_00);
    in_RDX._M_pi = extraout_RDX;
    if (local_38.super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.
                 super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      in_RDX._M_pi = extraout_RDX_00;
    }
    if ((tuple<cppcms::sessions::encryptor_*,_std::default_delete<cppcms::sessions::encryptor>_>)
        local_40._M_t.
        super___uniq_ptr_impl<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
        ._M_t.
        super__Tuple_impl<0UL,_cppcms::sessions::encryptor_*,_std::default_delete<cppcms::sessions::encryptor>_>
        .super__Head_base<0UL,_cppcms::sessions::encryptor_*,_false>._M_head_impl !=
        (_Head_base<0UL,_cppcms::sessions::encryptor_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_40._M_t.
          super___uniq_ptr_impl<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
          ._M_t.
          super__Tuple_impl<0UL,_cppcms::sessions::encryptor_*,_std::default_delete<cppcms::sessions::encryptor>_>
          .super__Head_base<0UL,_cppcms::sessions::encryptor_*,_false>._M_head_impl)[3])();
      in_RDX._M_pi = extraout_RDX_01;
    }
  }
  sVar2.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppcms::session_api>)
         sVar2.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<session_api> get() 
	{
		booster::shared_ptr<session_api> p;
		if(pool_->storage_.get() && pool_->encryptor_.get())
			p.reset(new session_dual(pool_->encryptor_->get(),pool_->storage_->get(),limit_));
		return p;
	}